

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void get_target_assign_pos(tgestate_t *state,vischar_t *vischar,route_t *route)

{
  uint8_t uVar1;
  mappos8_t **in_RDX;
  route_t *in_RSI;
  tgestate_t *in_RDI;
  pos8_t *location;
  mappos8_t *doormappos;
  uint8_t get_target_result;
  route_t *in_stack_ffffffffffffffd0;
  vischar_t *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  uVar1 = get_target(in_RDI,in_RSI,in_RDX,
                     (pos8_t **)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  if (uVar1 == 0xff) {
    route_ended((tgestate_t *)CONCAT17(0xff,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
                in_stack_ffffffffffffffd0);
  }
  else if (uVar1 == 0x80) {
    in_RSI->step = in_RSI->step | 0x40;
    in_RSI[2].index = in_stack_ffffffffffffffd8->character;
    in_RSI[2].step = in_stack_ffffffffffffffd8->flags;
  }
  else {
    in_RSI[2].index = in_stack_ffffffffffffffd0->index;
    in_RSI[2].step = in_stack_ffffffffffffffd0->step;
  }
  return;
}

Assistant:

void get_target_assign_pos(tgestate_t *state,
                           vischar_t  *vischar,
                           route_t    *route)
{
  uint8_t          get_target_result; /* was A */
  const mappos8_t *doormappos;        /* was HL */
  const pos8_t    *location;          /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  get_target_result = get_target(state, route, &doormappos, &location);
  if (get_target_result != get_target_ROUTE_ENDS)
  {
    /* "Didn't hit end of list" case. */
    /* Conv: Inlined $CB61/handle_target here since we're the only user. */

    if (get_target_result == get_target_DOOR)
      vischar->flags |= vischar_FLAGS_TARGET_IS_DOOR;

    /* Conv: In the original game HL returns a doorpos or a location to
     * transfer. This version must cope with get_target() returning results in
     * different vars. */
    if (get_target_result == get_target_DOOR)
    {
      vischar->target.u = doormappos->u;
      vischar->target.v = doormappos->v;
    }
    else
    {
      vischar->target.u = location->x;
      vischar->target.v = location->y;
    }
  }
  else
  {
    route_ended(state, vischar, route); /* was fallthrough */
  }
}